

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

bool_t priNextPrime(word *p,word *a,size_t n,size_t trials,size_t base_count,size_t iter,void *stack
                   )

{
  bool bVar1;
  bool bVar2;
  bool_t bVar3;
  size_t sVar4;
  word wVar5;
  size_t sVar6;
  long lVar7;
  size_t count;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  word *mods;
  bool_t local_50;
  
  sVar4 = wwBitSize(a,n);
  if (sVar4 < 2) {
LAB_00130b66:
    local_50 = 0;
  }
  else {
    wwCopy(p,a,n);
    uVar8 = *p;
    *p = uVar8 | 1;
    count = base_count;
    if (base_count == 0 || n != 1) {
      priBaseMod((word *)stack,p,n,base_count);
      if (base_count == 0) {
        bVar1 = true;
        bVar2 = true;
        count = 0;
      }
      else {
LAB_00130c1f:
        bVar1 = false;
        sVar6 = 0;
        do {
          if (*(long *)((long)stack + sVar6 * 8) == 0) goto LAB_00130c38;
          sVar6 = sVar6 + 1;
        } while (count != sVar6);
        bVar1 = true;
LAB_00130c38:
        bVar2 = false;
      }
    }
    else {
      do {
        if (*(ulong *)(&DAT_0013e8a8 + count * 8) < (uVar8 | 1)) {
          priBaseMod((word *)stack,p,n,count);
          goto LAB_00130c1f;
        }
        count = count - 1;
      } while (count != 0);
      count = 0;
      priBaseMod((word *)stack,p,n,0);
      bVar1 = true;
      bVar2 = true;
    }
    while( true ) {
      if (trials == 0xffffffffffffffff) {
        trials = 0xffffffffffffffff;
      }
      else {
        bVar9 = trials == 0;
        trials = trials - 1;
        if (bVar9) goto LAB_00130b66;
      }
      if ((bVar1) &&
         (bVar3 = priRMTest(p,n,iter,(void *)(base_count * 8 + (long)stack)), bVar3 != 0)) break;
      wVar5 = zzAddW2(p,n,2);
      if (wVar5 != 0) {
        return 0;
      }
      sVar6 = wwBitSize(p,n);
      if (sVar4 < sVar6) {
        return 0;
      }
      bVar1 = true;
      if (!bVar2) {
        bVar9 = true;
        bVar1 = true;
        lVar7 = 0;
        sVar6 = count;
        do {
          uVar8 = *(ulong *)((long)stack + lVar7);
          if (uVar8 < *(long *)((long)_base + lVar7) - 2U) {
            uVar8 = uVar8 + 2;
          }
          else {
            bVar10 = uVar8 == *(long *)((long)_base + lVar7) - 1U;
            uVar8 = (ulong)bVar10;
            bVar1 = bVar9;
            if (!bVar10) {
              bVar1 = false;
              bVar9 = bVar1;
            }
          }
          *(ulong *)((long)stack + lVar7) = uVar8;
          lVar7 = lVar7 + 8;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
    }
    local_50 = 1;
  }
  return local_50;
}

Assistant:

bool_t priNextPrime(word p[], const word a[], size_t n, size_t trials,
	size_t base_count, size_t iter, void* stack)
{
	size_t l;
	size_t i;
	bool_t base_success;
	// переменные в stack
	word* mods;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, p, n));
	ASSERT(base_count <= priBaseSize());
	// раскладка stack
	mods = (word*)stack;
	stack = mods + base_count;
	// l <- битовая длина a
	l = wwBitSize(a, n);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// p <- минимальное нечетное >= a
	wwCopy(p, a, n);
	p[0] |= 1;
	// малое p?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) >= p[0])
			--base_count;
	// рассчитать остатки от деления на малые простые
	priBaseMod(mods, p, n, base_count);
	for (i = 0, base_success = TRUE; i < base_count; ++i)
		if (mods[i] == 0)
		{
			base_success = FALSE;
			break;
		}
	// попытки
	while (trials == SIZE_MAX || trials--)
	{
		// проверка простоты
		if (base_success && priRMTest(p, n, iter, stack))
			return TRUE;
		// к следующему кандидату
		if (zzAddW2(p, n, 2) || wwBitSize(p, n) > l)
			return FALSE;
		for (i = 0, base_success = TRUE; i < base_count; ++i)
		{
			if (mods[i] < _base[i] - 2)
				mods[i] += 2;
			else if (mods[i] == _base[i] - 1)
				mods[i] = 1;
			else
				mods[i] = 0, base_success = FALSE;
		}
	}
	return FALSE;
}